

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O3

PagePoolPage * __thiscall Memory::PagePool::GetPage(PagePool *this,bool useReservedPages)

{
  code *pcVar1;
  bool bVar2;
  PagePoolPage *pPVar3;
  char *message;
  char *error;
  PagePoolPage *page;
  PagePoolFreePage *pPVar4;
  uint lineNumber;
  undefined4 *puVar5;
  undefined8 *in_FS_OFFSET;
  PageSegment *local_20;
  PageSegment *pageSegment;
  
  pPVar4 = this->freePageList;
  if (pPVar4 == (PagePoolFreePage *)0x0) {
    if ((!useReservedPages) || (pPVar4 = this->reservedPageList, pPVar4 == (PagePoolFreePage *)0x0))
    {
      pPVar3 = (PagePoolPage *)
               PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               ::AllocPages(&this->pageAllocator,1,&local_20);
      if (pPVar3 == (PagePoolPage *)0x0) {
        return (PagePoolPage *)0x0;
      }
      pPVar3->pageAllocator = &this->pageAllocator;
      pPVar3->pageSegment = local_20;
      pPVar3->isReserved = false;
      return pPVar3;
    }
    this->reservedPageList = pPVar4->nextFreePage;
    if ((pPVar4->super_PagePoolPage).isReserved != false) {
      return &pPVar4->super_PagePoolPage;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    error = "(page->IsReserved())";
    message = "page->IsReserved()";
    lineNumber = 0x7a;
  }
  else {
    this->freePageList = pPVar4->nextFreePage;
    if ((pPVar4->super_PagePoolPage).isReserved != true) {
      return &pPVar4->super_PagePoolPage;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    error = "(!page->IsReserved())";
    message = "!page->IsReserved()";
    lineNumber = 0x72;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar5 = 0;
    return &pPVar4->super_PagePoolPage;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

PagePoolPage * GetPage(bool useReservedPages = false)
    {
        if (freePageList != nullptr)
        {
            PagePoolPage * page = freePageList;
            freePageList = freePageList->nextFreePage;
            Assert(!page->IsReserved());
            return page;
        }

        if (useReservedPages && reservedPageList != nullptr)
        {
            PagePoolPage * page = reservedPageList;
            reservedPageList = reservedPageList->nextFreePage;
            Assert(page->IsReserved());
            return page;
        }

        return PagePoolPage::New(&pageAllocator);
    }